

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

IterateResult __thiscall gl4cts::EnhancedLayouts::APIErrorsTest::iterate(APIErrorsTest *this)

{
  GLuint GVar1;
  int iVar2;
  undefined4 extraout_var;
  char *description;
  bool test_result;
  allocator<char> local_1a6;
  allocator<char> local_1a5;
  allocator<char> local_1a4;
  allocator<char> local_1a3;
  allocator<char> local_1a2;
  allocator<char> local_1a1;
  GLint param;
  GLint length;
  Program program;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  GLchar name [64];
  long lVar3;
  
  length = 0;
  param = 0;
  program.m_compute.m_context = (this->super_TestCase).m_context;
  program.m_id = 0;
  program.m_compute.m_id = 0;
  program.m_fragment.m_id = 0;
  program.m_geometry.m_id = 0;
  program.m_tess_ctrl.m_id = 0;
  program.m_tess_eval.m_id = 0;
  program.m_vertex.m_id = 0;
  test_result = true;
  program.m_fragment.m_context = program.m_compute.m_context;
  program.m_geometry.m_context = program.m_compute.m_context;
  program.m_tess_ctrl.m_context = program.m_compute.m_context;
  program.m_tess_eval.m_context = program.m_compute.m_context;
  program.m_vertex.m_context = program.m_compute.m_context;
  program.m_context = program.m_compute.m_context;
  iVar2 = (*(program.m_compute.m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,glcts::fixed_sample_locations_values + 1,&local_1a1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,
             "#version 430 core\n#extension GL_ARB_enhanced_layouts : require\n\nin  vec4 vs_fs;\nout vec4 fs_out;\n\nvoid main()\n{\n    fs_out = vs_fs;\n}\n\n"
             ,&local_1a2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,glcts::fixed_sample_locations_values + 1,&local_1a3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,glcts::fixed_sample_locations_values + 1,&local_1a4);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_128,glcts::fixed_sample_locations_values + 1,&local_1a5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,
             "#version 430 core\n#extension GL_ARB_enhanced_layouts : require\n\nin  vec4 in_vs;\nlayout (xfb_offset = 16) out vec4 vs_fs;\n\nvoid main()\n{\n    vs_fs = in_vs;\n}\n\n"
             ,&local_1a6);
  Utils::Program::Init(&program,&local_a8,&local_c8,&local_e8,&local_108,&local_128,&local_88,false)
  ;
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_a8);
  GVar1 = program.m_id;
  (**(code **)(lVar3 + 0x990))(program.m_id,0x8c8e,0x92f6,&param);
  checkError(this,0x502,"GetProgramInterfaceiv(GL_TRANSFORM_FEEDBACK_BUFFER, GL_MAX_NAME_LENGTH)",
             &test_result);
  (**(code **)(lVar3 + 0x9a8))(GVar1,0x8c8e,"0");
  checkError(this,0x500,"GetProgramResourceIndex(GL_TRANSFORM_FEEDBACK_BUFFER)",&test_result);
  (**(code **)(lVar3 + 0x9c0))(GVar1,0x8c8e,0,0x40,&length,name);
  checkError(this,0x500,"GetProgramResourceName(GL_TRANSFORM_FEEDBACK_BUFFER)",&test_result);
  description = "Fail";
  if (test_result != QP_TEST_RESULT_PASS) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            (((this->super_TestCase).m_context)->m_testCtx,test_result ^ QP_TEST_RESULT_FAIL,
             description);
  Utils::Program::~Program(&program);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult APIErrorsTest::iterate()
{
	GLint		   length = 0;
	GLchar		   name[64];
	GLint		   param = 0;
	Utils::Program program(m_context);
	bool		   test_result = true;

	const Functions& gl = m_context.getRenderContext().getFunctions();

	try
	{
		program.Init("" /* cs */, "#version 430 core\n"
								  "#extension GL_ARB_enhanced_layouts : require\n"
								  "\n"
								  "in  vec4 vs_fs;\n"
								  "out vec4 fs_out;\n"
								  "\n"
								  "void main()\n"
								  "{\n"
								  "    fs_out = vs_fs;\n"
								  "}\n"
								  "\n" /* fs */,
					 "" /* gs */, "" /* tcs */, "" /* tes */, "#version 430 core\n"
															  "#extension GL_ARB_enhanced_layouts : require\n"
															  "\n"
															  "in  vec4 in_vs;\n"
															  "layout (xfb_offset = 16) out vec4 vs_fs;\n"
															  "\n"
															  "void main()\n"
															  "{\n"
															  "    vs_fs = in_vs;\n"
															  "}\n"
															  "\n" /* vs */,
					 false /* separable */);
	}
	catch (Utils::Shader::InvalidSourceException& exc)
	{
		exc.log(m_context);
		TCU_FAIL(exc.what());
	}
	catch (Utils::Program::BuildException& exc)
	{
		TCU_FAIL(exc.what());
	}

	/*
	 * - GetProgramInterfaceiv should generate INVALID_OPERATION when
	 * <programInterface> is TRANSFORM_FEEDBACK_BUFFER and <pname> is one of the
	 * following:
	 *   * MAX_NAME_LENGTH,
	 *   * MAX_NUM_ACTIVE_VARIABLES;
	 */
	gl.getProgramInterfaceiv(program.m_id, GL_TRANSFORM_FEEDBACK_BUFFER, GL_MAX_NAME_LENGTH, &param);
	checkError(GL_INVALID_OPERATION, "GetProgramInterfaceiv(GL_TRANSFORM_FEEDBACK_BUFFER, GL_MAX_NAME_LENGTH)",
			   test_result);

	/*
	 * - GetProgramResourceIndex should generate INVALID_ENUM when
	 * <programInterface> is TRANSFORM_FEEDBACK_BUFFER;
	 */
	gl.getProgramResourceIndex(program.m_id, GL_TRANSFORM_FEEDBACK_BUFFER, "0");
	checkError(GL_INVALID_ENUM, "GetProgramResourceIndex(GL_TRANSFORM_FEEDBACK_BUFFER)", test_result);
	/*
	 * - GetProgramResourceName should generate INVALID_ENUM when
	 * <programInterface> is TRANSFORM_FEEDBACK_BUFFER;
	 */
	gl.getProgramResourceName(program.m_id, GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* index */, 64 /* bufSize */, &length,
							  name);
	checkError(GL_INVALID_ENUM, "GetProgramResourceName(GL_TRANSFORM_FEEDBACK_BUFFER)", test_result);

	/* Set result */
	if (true == test_result)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return tcu::TestNode::STOP;
}